

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

bool __thiscall NJamSpell::TTokenizer::LoadAlphabet(TTokenizer *this,string *alphabetFile)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  undefined1 local_c0 [8];
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  alphabet;
  string data;
  wstring wdata;
  int local_34 [2];
  wchar_t chr;
  
  LoadFile((string *)&alphabet._M_h._M_single_bucket,alphabetFile);
  if (data._M_dataplus._M_p == (pointer)0x0) {
    bVar5 = false;
    goto LAB_00112431;
  }
  UTF8ToWide((wstring *)((long)&data.field_2 + 8),(string *)&alphabet._M_h._M_single_bucket);
  uVar1 = data.field_2._8_8_;
  if (wdata._M_dataplus._M_p == (pointer)0x0) {
    bVar5 = false;
  }
  else {
    lVar4 = (long)wdata._M_dataplus._M_p << 2;
    lVar6 = 0;
    do {
      uVar3 = (**(code **)(*GWctype + 0x40))(GWctype,*(undefined4 *)(uVar1 + lVar6));
      uVar2 = data.field_2._8_8_;
      *(undefined4 *)(uVar1 + lVar6) = uVar3;
      lVar6 = lVar6 + 4;
    } while (lVar4 != lVar6);
    local_c0 = (undefined1  [8])&alphabet._M_h._M_rehash_policy._M_next_resize;
    alphabet._M_h._M_buckets = (__buckets_ptr)0x1;
    alphabet._M_h._M_bucket_count = 0;
    alphabet._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    alphabet._M_h._M_element_count._0_4_ = 0x3f800000;
    alphabet._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    alphabet._M_h._M_rehash_policy._4_4_ = 0;
    alphabet._M_h._M_rehash_policy._M_next_resize = 0;
    if (wdata._M_dataplus._M_p == (pointer)0x0) {
LAB_0011240b:
      bVar5 = false;
    }
    else {
      lVar4 = 0;
      do {
        local_34[0] = *(int *)(uVar2 + lVar4);
        if ((local_34[0] != 10) && (local_34[0] != 0xd)) {
          wdata.field_2._8_8_ =
               (_Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_c0;
          std::
          _Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wchar_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wchar_t,false>>>>
                    ((_Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_c0,local_34,(undefined1 *)((long)&wdata.field_2 + 8));
        }
        lVar4 = lVar4 + 4;
      } while ((long)wdata._M_dataplus._M_p << 2 != lVar4);
      if (alphabet._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) goto LAB_0011240b;
      bVar5 = true;
      if ((_Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)local_c0 !=
          (_Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)&this->Alphabet) {
        std::
        _Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                  ((_Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->Alphabet,
                   (_Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_c0);
      }
    }
    std::
    _Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_c0);
  }
  if ((size_type *)data.field_2._8_8_ != &wdata._M_string_length) {
    operator_delete((void *)data.field_2._8_8_);
  }
LAB_00112431:
  if (alphabet._M_h._M_single_bucket != (__node_base_ptr)&data._M_string_length) {
    operator_delete(alphabet._M_h._M_single_bucket);
  }
  return bVar5;
}

Assistant:

bool TTokenizer::LoadAlphabet(const std::string& alphabetFile) {
    std::string data = LoadFile(alphabetFile);
    if (data.empty()) {
        return false;
    }
    std::wstring wdata = UTF8ToWide(data);
    if (wdata.empty()) {
        return false;
    }
    ToLower(wdata);
    std::unordered_set<wchar_t> alphabet;
    for (auto chr: wdata) {
        if (chr == 10 || chr == 13) {
            continue;
        }
        alphabet.insert(chr);
    }
    if (alphabet.empty()) {
        return false;
    }
    Alphabet = alphabet;
    return true;
}